

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_gej_cmov(secp256k1_gej *a,secp256k1_gej *b)

{
  int iVar1;
  void *in_RDI;
  secp256k1_gej t;
  secp256k1_gej *in_stack_ffffffffffffff58;
  secp256k1_gej *in_stack_ffffffffffffff60;
  
  memcpy(&stack0xffffffffffffff58,in_RDI,0x98);
  secp256k1_gej_cmov(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
  iVar1 = gej_xyz_equals_gej((secp256k1_gej *)t._144_8_,(secp256k1_gej *)t.z._40_8_);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xfb9,"test condition failed: gej_xyz_equals_gej(&t, a)");
    abort();
  }
  secp256k1_gej_cmov(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
  iVar1 = gej_xyz_equals_gej((secp256k1_gej *)t._144_8_,(secp256k1_gej *)t.z._40_8_);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xfbb,"test condition failed: gej_xyz_equals_gej(&t, b)");
    abort();
  }
  return;
}

Assistant:

static void test_gej_cmov(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej t = *a;
    secp256k1_gej_cmov(&t, b, 0);
    CHECK(gej_xyz_equals_gej(&t, a));
    secp256k1_gej_cmov(&t, b, 1);
    CHECK(gej_xyz_equals_gej(&t, b));
}